

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

uint32_t address_space_ldl_le_mips
                   (uc_struct_conflict4 *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  uint32_t uVar1;
  
  uVar1 = address_space_ldl_internal_mips(uc,as,addr,attrs,result,DEVICE_LITTLE_ENDIAN);
  return uVar1;
}

Assistant:

uint32_t glue(address_space_ldl_le, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    return glue(address_space_ldl_internal, SUFFIX)(uc, ARG1, addr, attrs, result,
                                                    DEVICE_LITTLE_ENDIAN);
}